

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall
miniros::Connection::writeHeader
          (Connection *this,M_string *key_vals,WriteFinishedFunc *finished_callback)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar2;
  uint32_t len;
  shared_ptr<unsigned_char[]> buffer;
  shared_ptr<unsigned_char[]> full_msg;
  uint local_6c;
  void *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  Connection *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  code *local_40;
  code *local_38;
  uint *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::function<void_(const_std::shared_ptr<miniros::Connection>_&)>::operator=
            (&this->header_written_callback_,finished_callback);
  iVar1 = (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Transport[0xb])();
  if ((char)iVar1 == '\0') {
    std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::Connection,void>
              ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
    onHeaderWritten(this,(ConnectionPtr *)&local_50);
    this_00 = local_48;
  }
  else {
    local_68 = (void *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Header::write((int)key_vals,&local_68,(size_t)&local_6c);
    uVar2 = local_6c + 4;
    local_30 = (uint *)operator_new__((ulong)uVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<unsigned_char*,std::__sp_array_delete,std::allocator<void>,void>
              (&local_28,local_30);
    memcpy(local_30 + 1,local_68,(ulong)local_6c);
    *local_30 = local_6c;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:394:17)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:394:17)>
               ::_M_manager;
    local_50 = this;
    write(this,(int)&local_30,(void *)(ulong)uVar2,(size_t)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,3);
    }
    this_00 = p_Stack_60;
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
      this_00 = p_Stack_60;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void Connection::writeHeader(const M_string& key_vals, const WriteFinishedFunc& finished_callback)
{
  MINIROS_ASSERT(!header_written_callback_);
  header_written_callback_ = finished_callback;

  if (!transport_->requiresHeader())
  {
    onHeaderWritten(shared_from_this());
    return;
  }

  std::shared_ptr<uint8_t[]> buffer;
  uint32_t len;
  Header::write(key_vals, buffer, len);

  uint32_t msg_len = len + 4;
  std::shared_ptr<uint8_t[]> full_msg(new uint8_t[msg_len]);
  memcpy(full_msg.get() + 4, buffer.get(), len);
  *((uint32_t*)full_msg.get()) = len;

  auto wrapFn = [this](const ConnectionPtr& conn)
  {
    this->onHeaderWritten(conn);
  };
  write(full_msg, msg_len, wrapFn, false);
}